

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triple.cpp
# Opt level: O1

void parseVersionFromName(StringRef Name,uint *Major,uint *Minor,uint *Micro)

{
  char *pcVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  size_t sVar8;
  uint *Components [3];
  uint *local_18 [3];
  
  sVar6 = Name.Length;
  pcVar7 = Name.Data;
  *Micro = 0;
  *Minor = 0;
  *Major = 0;
  local_18[0] = Major;
  local_18[1] = Minor;
  local_18[2] = Micro;
  if (sVar6 != 0) {
    lVar2 = 0;
    while (0xf5 < (byte)(*pcVar7 - 0x3aU)) {
      if (9 < (byte)(*pcVar7 - 0x30U)) {
        __assert_fail("!Str.empty() && Str[0] >= \'0\' && Str[0] <= \'9\' && \"Not a number\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/Triple.cpp"
                      ,0x3c9,"unsigned int EatNumber(StringRef &)");
      }
      pcVar3 = pcVar7 + (sVar6 - 1);
      pcVar1 = pcVar7 + sVar6;
      uVar5 = 0;
      do {
        pcVar4 = pcVar7;
        sVar8 = sVar6;
        uVar5 = ((int)*pcVar4 + uVar5 * 10) - 0x30;
        if (sVar8 == 1) {
          sVar8 = 1;
          sVar6 = 0;
          pcVar4 = pcVar3;
          pcVar7 = pcVar1;
          break;
        }
        pcVar7 = pcVar4 + 1;
        sVar6 = sVar8 - 1;
      } while ((byte)(pcVar4[1] - 0x30U) < 10);
      *local_18[lVar2] = uVar5;
      if ((sVar6 != 0) && (*pcVar7 == '.')) {
        pcVar7 = pcVar4 + 2;
        sVar6 = sVar8 - 2;
      }
      lVar2 = lVar2 + 1;
      if (lVar2 == 3) {
        return;
      }
      if (sVar6 == 0) {
        return;
      }
    }
  }
  return;
}

Assistant:

static void parseVersionFromName(StringRef Name, unsigned &Major,
                                 unsigned &Minor, unsigned &Micro) {
  // Any unset version defaults to 0.
  Major = Minor = Micro = 0;

  // Parse up to three components.
  unsigned *Components[3] = {&Major, &Minor, &Micro};
  for (unsigned i = 0; i != 3; ++i) {
    if (Name.empty() || Name[0] < '0' || Name[0] > '9')
      break;

    // Consume the leading number.
    *Components[i] = EatNumber(Name);

    // Consume the separator, if present.
    if (Name.startswith("."))
      Name = Name.substr(1);
  }
}